

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall
choc::value::Value::addMember<choc::value::ValueView,char_const(&)[11],double&>
          (Value *this,string_view name,ValueView *v,char (*others) [11],double *others_1)

{
  Content *pCVar1;
  ComplexArray *other;
  undefined8 __ptr;
  Allocator *pAVar2;
  char (*pacVar3) [11];
  Object *pOVar4;
  Object *this_00;
  size_t sVar5;
  string_view name_00;
  Type local_90;
  double *local_70;
  char (*local_68) [11];
  ValueView local_60;
  
  local_90.mainType = (v->type).mainType;
  pCVar1 = &(v->type).content;
  local_90.content.object = (Object *)0x0;
  local_90.allocator = (Allocator *)0x0;
  local_70 = others_1;
  local_68 = others;
  if (local_90.mainType == object) {
    pOVar4 = pCVar1->object;
    this_00 = (Object *)malloc(0x28);
    Type::Object::Object(this_00,(Allocator *)0x0,pOVar4);
    local_90.content.object = this_00;
  }
  else if (local_90.mainType == complexArray) {
    other = pCVar1->complexArray;
    pOVar4 = (Object *)malloc(0x18);
    Type::ComplexArray::ComplexArray((ComplexArray *)pOVar4,(Allocator *)0x0,other);
    local_90.content._0_8_ = pOVar4;
  }
  else {
    local_90.content._8_8_ = *(undefined8 *)((long)&(v->type).content + 8);
    local_90.content.object = pCVar1->object;
  }
  Type::addObjectMember(&(this->value).type,name,&local_90);
  pAVar2 = local_90.allocator;
  __ptr = local_90.content.object;
  if ((char)local_90.mainType < '\0') {
    if (local_90.mainType == object) {
      if (local_90.content.object != (Object *)0x0) {
        Type::Object::~Object(local_90.content.object);
        goto LAB_00273bcf;
      }
    }
    else if ((local_90.mainType == complexArray) && (local_90.content.object != (Object *)0x0)) {
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_90.content.object);
LAB_00273bcf:
      if (pAVar2 == (Allocator *)0x0) {
        free((void *)__ptr);
      }
      else {
        (**(code **)(*(long *)pAVar2 + 0x20))(pAVar2,__ptr);
      }
    }
  }
  ValueView::ValueView(&local_60,v);
  appendValue(this,&local_60);
  if ((char)local_60.type.mainType < '\0') {
    if (local_60.type.mainType == object) {
      if (local_60.type.content.object == (Object *)0x0) goto LAB_00273b33;
      Type::Object::~Object(local_60.type.content.object);
    }
    else {
      if ((local_60.type.mainType != complexArray) ||
         (local_60.type.content.object == (Object *)0x0)) goto LAB_00273b33;
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_60.type.content.object);
    }
    if (local_60.type.allocator == (Allocator *)0x0) {
      free(local_60.type.content.object);
    }
    else {
      (**(code **)(*(long *)local_60.type.allocator + 0x20))
                (local_60.type.allocator,local_60.type.content.object);
    }
  }
LAB_00273b33:
  pacVar3 = local_68;
  sVar5 = strlen(*local_68);
  name_00._M_str = *pacVar3;
  name_00._M_len = sVar5;
  addMember<double>(this,name_00,*local_70);
  return;
}

Assistant:

void Value::addMember (std::string_view name, MemberType v, Others&&... others)
{
    static_assert ((sizeof...(others) & 1) == 0, "The arguments must be a sequence of name, value pairs");

    static_assert (isPrimitiveType<MemberType>() || isStringType<MemberType>() || isValueType<MemberType>(),
                   "The template type needs to be one of the supported primitive types");

    if constexpr (isValueType<MemberType>())
    {
        value.type.addObjectMember (name, v.getType());
        appendValue (v);
    }
    else if constexpr (isStringType<MemberType>())
    {
        auto stringHandle = dictionary.getHandleForString (v);
        appendMember (name, Type::createString(), std::addressof (stringHandle.handle), sizeof (stringHandle.handle));
    }
    else if constexpr (matchesType<MemberType, int32_t>())   { appendMember (name, Type::createInt32(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, int64_t>())   { appendMember (name, Type::createInt64(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, float>())     { appendMember (name, Type::createFloat32(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, double>())    { appendMember (name, Type::createFloat64(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, bool>())      { uint8_t b = v ? 1 : 0; appendMember (name, Type::createBool(), std::addressof (b), sizeof (b)); }

    if constexpr (sizeof...(others) != 0)
        addMember (std::forward<Others> (others)...);
}